

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void GetArgumentRegisters
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  uint uVar1;
  uchar rA;
  VmValue *pVVar2;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 1) {
      LowerConstantIntoBlock(ctx,lowFunction,lowBlock,result,value);
      return;
    }
    if ((value != (VmValue *)0x0) && (pVVar2 = value, value->typeID == 4)) goto LAB_0019e4f8;
  }
  pVVar2 = (VmValue *)0x0;
LAB_0019e4f8:
  if (pVVar2 != (VmValue *)0x0) {
    rA = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
    RegVmLoweredBlock::AddInstruction
              (lowBlock,ctx,pVVar2->source,rviFuncAddr,rA,'\0','\0',
               *(uint *)((long)pVVar2[1]._vptr_VmValue + 0x44));
    if (result->count == result->max) {
      SmallArray<unsigned_char,_32U>::grow(result,result->count);
    }
    if (result->data == (uchar *)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<unsigned char, 32>::push_back(const T &) [T = unsigned char, N = 32]"
                   );
    }
    uVar1 = result->count;
    result->count = uVar1 + 1;
    result->data[uVar1] = rA;
    if (pVVar2 != (VmValue *)0x0) {
      return;
    }
  }
  RegVmLoweredFunction::GetRegisters(lowFunction,result,value);
  return;
}

Assistant:

void GetArgumentRegisters(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, SmallArray<unsigned char, 32> &result, VmValue *value)
{
	if(isType<VmConstant>(value))
	{
		LowerConstantIntoBlock(ctx, lowFunction, lowBlock, result, value);

		return;
	}

	if(VmFunction *function = getType<VmFunction>(value))
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, function->source, rviFuncAddr, targetReg, 0, 0, function->function->functionIndex);

		result.push_back(targetReg);

		return;
	}

	lowFunction->GetRegisters(result, value);
}